

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

void Queue_Append(Queue *lead,Queue *follower)

{
  Queue *follower_local;
  Queue *lead_local;
  
  if (lead == (Queue *)0x0) {
    __assert_fail("lead!=NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/queue.c"
                  ,0x50,"void Queue_Append(struct Queue *, struct Queue *)");
  }
  if (follower != (Queue *)0x0) {
    if (lead->last == (Queue_Node *)0x0) {
      lead->last = follower->last;
      lead->first = follower->first;
      lead->size = follower->size;
    }
    else {
      lead->last->prev = follower->first;
      lead->last = follower->last;
      lead->size = follower->size + lead->size;
    }
    return;
  }
  __assert_fail("follower!=NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/queue.c"
                ,0x51,"void Queue_Append(struct Queue *, struct Queue *)");
}

Assistant:

void Queue_Append(struct Queue *lead,struct Queue *follower)
{
	assert(lead!=NULL);	
	assert(follower!=NULL);	
	if(lead->last==NULL)
	{
		lead->last=follower->last;
		lead->first=follower->first;
		lead->size=follower->size;
	}else
	{
		lead->last->prev=follower->first;
		lead->last=follower->last;
		lead->size+=follower->size;
	}
}